

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O3

void rol_26(void)

{
  bool bVar1;
  
  except = '\0';
  bVar1 = carry_f != '\0';
  temp2 = getbyte(pc);
  carry_f = RAM[temp2] & 0x80;
  result_f = RAM[temp2] * '\x02' | bVar1;
  RAM[temp2] = result_f;
  pc = pc + 1;
  return;
}

Assistant:

void rol_26(void) {

    ubyte oldcar;
    oldcar = carry_f;
    CLE;
    result_f = RAM[temp2 = getbyte(pc)];

    carry_f = result_f & 0x80;
    result_f <<= 1;
    if (oldcar) result_f++;

    RAM[temp2] = result_f;
    pc++;
}